

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::EOR_IM(CPU *this)

{
  byte bVar1;
  CPU *this_local;
  
  this->cycles = 2;
  bVar1 = GetByte(this);
  this->A = this->A ^ bVar1;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->A == '\0') << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((this->A & 0x80) != 0 && -1 < (int)(this->A & 0x80)) << 7;
  return;
}

Assistant:

void CPU::EOR_IM()
{
    cycles = 2;
    A ^= GetByte();
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}